

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  unsigned_short *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar5 = obj->CurLenW;
  if (iVar5 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0xc84,
                  "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                 );
  }
  uVar1 = obj->UserFlags;
  lVar6 = (long)new_text_len;
  iVar4 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar6);
  if (((uVar1 >> 0x12 & 1) == 0) && (obj->BufCapacityA <= obj->CurLenA + iVar4)) {
LAB_002155f7:
    bVar3 = false;
  }
  else {
    iVar8 = (obj->TextW).Size;
    if (iVar8 <= new_text_len + iVar5) {
      if ((uVar1 >> 0x12 & 1) == 0) goto LAB_002155f7;
      if (iVar8 <= iVar5) {
        __assert_fail("text_len < obj->TextW.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                      ,0xc8f,
                      "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                     );
      }
      iVar8 = 0x100;
      if (0x100 < new_text_len) {
        iVar8 = new_text_len;
      }
      if (new_text_len * 4 < iVar8) {
        iVar8 = new_text_len * 4;
      }
      iVar10 = 0x20;
      if (7 < new_text_len) {
        iVar10 = iVar8;
      }
      iVar9 = iVar10 + iVar5 + 1;
      iVar8 = (obj->TextW).Capacity;
      if (iVar8 <= iVar10 + iVar5) {
        if (iVar8 == 0) {
          iVar10 = 8;
        }
        else {
          iVar10 = iVar8 / 2 + iVar8;
        }
        if (iVar10 <= iVar9) {
          iVar10 = iVar9;
        }
        if (iVar8 < iVar10) {
          puVar7 = (unsigned_short *)ImGui::MemAlloc((long)iVar10 * 2);
          puVar2 = (obj->TextW).Data;
          if (puVar2 != (unsigned_short *)0x0) {
            memcpy(puVar7,puVar2,(long)(obj->TextW).Size * 2);
            ImGui::MemFree((obj->TextW).Data);
          }
          (obj->TextW).Data = puVar7;
          (obj->TextW).Capacity = iVar10;
        }
      }
      (obj->TextW).Size = iVar9;
    }
    puVar2 = (obj->TextW).Data;
    if (iVar5 - pos != 0) {
      puVar7 = puVar2 + pos;
      memmove(puVar7 + lVar6,puVar7,(long)(iVar5 - pos) * 2);
    }
    memcpy(puVar2 + pos,new_text,lVar6 * 2);
    lVar6 = obj->CurLenW + lVar6;
    iVar5 = (int)lVar6;
    obj->CurLenW = iVar5;
    obj->CurLenA = obj->CurLenA + iVar4;
    if ((obj->TextW).Size <= iVar5) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x503,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
    }
    (obj->TextW).Data[lVar6] = 0;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}